

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_commit_hook(sqlite3 *db,_func_int_void_ptr *xCallback,void *pArg)

{
  void *pvVar1;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    pvVar1 = db->pCommitArg;
    db->xCommitCallback = xCallback;
    db->pCommitArg = pArg;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    pvVar1 = db->pCommitArg;
    db->xCommitCallback = xCallback;
    db->pCommitArg = pArg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_commit_hook(
  sqlite3 *db,              /* Attach the hook to this database */
  int (*xCallback)(void*),  /* Function to invoke on each commit */
  void *pArg                /* Argument to the function */
){
  void *pOld;
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pCommitArg;
  db->xCommitCallback = xCallback;
  db->pCommitArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}